

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O3

int32_t * ures_getIntVector_63(UResourceBundle *resB,int32_t *len,UErrorCode *status)

{
  UErrorCode UVar1;
  int32_t *piVar2;
  
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (resB == (UResourceBundle *)0x0) {
      UVar1 = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      piVar2 = res_getIntVector_63(&resB->fResData,resB->fRes,len);
      if (piVar2 != (int32_t *)0x0) {
        return piVar2;
      }
      UVar1 = U_RESOURCE_TYPE_MISMATCH;
    }
    *status = UVar1;
  }
  return (int32_t *)0x0;
}

Assistant:

U_CAPI const int32_t* U_EXPORT2 ures_getIntVector(const UResourceBundle* resB, int32_t* len, 
                                                   UErrorCode*               status) {
  const int32_t *p;
  if (status==NULL || U_FAILURE(*status)) {
    return NULL;
  }
  if(resB == NULL) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return NULL;
  }
  p = res_getIntVector(&(resB->fResData), resB->fRes, len);
  if (p == NULL) {
    *status = U_RESOURCE_TYPE_MISMATCH;
  }
  return p;
}